

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::handleBlockWithUnknownJump
          (RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> *this,RABlock *block)

{
  bool bVar1;
  size_type sVar2;
  Error EVar3;
  RABlock *this_00;
  RABlock *successor;
  RABlock *pRVar4;
  RABlock **ppRVar5;
  RABlock *in_RDI;
  RABlock *unaff_retaddr;
  RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> *in_stack_00000008;
  RABlock *candidate;
  size_t i;
  RABlock *consecutive;
  size_t blockCount;
  RABlocks *blocks;
  size_t in_stack_ffffffffffffffb8;
  RABlock *local_30;
  
  this_00 = (RABlock *)BaseRAPass::blocks(in_RDI->_ra);
  sVar2 = ZoneVectorBase::size((ZoneVectorBase *)this_00);
  successor = (RABlock *)(ulong)sVar2;
  pRVar4 = RABlock::consecutive(in_RDI);
  for (local_30 = (RABlock *)0x1; local_30 < successor;
      local_30 = (RABlock *)((long)&local_30->_ra + 1)) {
    ppRVar5 = ZoneVector<asmjit::_abi_1_10::RABlock_*>::operator[]
                        ((ZoneVector<asmjit::_abi_1_10::RABlock_*> *)in_RDI,
                         in_stack_ffffffffffffffb8);
    if ((*ppRVar5 != pRVar4) && (bVar1 = RABlock::isTargetable((RABlock *)0x178277), bVar1)) {
      RABlock::appendSuccessor(this_00,successor);
    }
  }
  EVar3 = shareAssignmentAcrossSuccessors(in_stack_00000008,unaff_retaddr);
  return EVar3;
}

Assistant:

Error handleBlockWithUnknownJump(RABlock* block) noexcept {
    RABlocks& blocks = _pass->blocks();
    size_t blockCount = blocks.size();

    // NOTE: Iterate from `1` as the first block is the entry block, we don't
    // allow the entry to be a successor of any block.
    RABlock* consecutive = block->consecutive();
    for (size_t i = 1; i < blockCount; i++) {
      RABlock* candidate = blocks[i];
      if (candidate == consecutive || !candidate->isTargetable())
        continue;
      block->appendSuccessor(candidate);
    }

    return shareAssignmentAcrossSuccessors(block);
  }